

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toc.c
# Opt level: O0

uint32_t cueify_toc_get_track_length(cueify_toc *t,uint8_t track)

{
  cueify_toc_private *toc;
  uint8_t track_local;
  cueify_toc *t_local;
  
  if (t == (cueify_toc *)0x0) {
    t_local._4_4_ = 0;
  }
  else if ((track < *(byte *)t) || (*(byte *)((long)t + 1) <= track)) {
    if (track == *(uint8_t *)((long)t + 1)) {
      t_local._4_4_ = *(int *)(t + 1) - *(int *)(t + (ulong)track + 1);
    }
    else {
      t_local._4_4_ = 0;
    }
  }
  else {
    t_local._4_4_ = *(int *)(t + (long)(int)(track + 1) + 1) - *(int *)(t + (ulong)track + 1);
  }
  return t_local._4_4_;
}

Assistant:

uint32_t cueify_toc_get_track_length(cueify_toc *t, uint8_t track) {
    cueify_toc_private *toc = (cueify_toc_private *)t;

    if (toc == NULL) {
	return 0;
    } else if (track >= toc->first_track_number &&
	       track < toc->last_track_number) {
	return toc->tracks[track + 1].lba - toc->tracks[track].lba;
    } else if (track == toc->last_track_number) {
	return toc->tracks[0].lba - toc->tracks[track].lba;
    } else {
	return 0;
    }
}